

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_TraceBleed(int damage,AActor *target,AActor *missile)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  TAngle<double> local_70;
  undefined1 local_68 [32];
  TAngle<double> local_48;
  TAngle<double> local_40;
  DThinker *local_38;
  double aim;
  TAngle<double> local_28;
  DAngle pitch;
  AActor *missile_local;
  AActor *target_local;
  int damage_local;
  
  pitch.Degrees = (double)missile;
  TAngle<double>::TAngle(&local_28);
  bVar3 = true;
  if (target != (AActor *)0x0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&aim + 4),
               SUB84(pitch.Degrees,0) +
               (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&aim + 4));
    bVar3 = uVar2 != 0;
  }
  if (!bVar3) {
    if ((*(double *)((long)pitch.Degrees + 0xb8) != 0.0) ||
       (NAN(*(double *)((long)pitch.Degrees + 0xb8)))) {
      dVar1 = *(double *)((long)pitch.Degrees + 0xb8);
      dVar4 = AActor::Distance2D(target,pitch.Degrees,false);
      local_38 = (DThinker *)c_atan(dVar1 / dVar4);
      TAngle<double>::ToDegrees(&local_48,(double)local_38);
      TAngle<double>::operator-(&local_40);
      TAngle<double>::operator=(&local_28,&local_40);
    }
    else {
      TAngle<double>::operator=(&local_28,0.0);
    }
    AActor::PosPlusZ((DVector3 *)(local_68 + 8),target,target->Height / 2.0);
    AActor::AngleTo((AActor *)local_68,(AActor *)pitch.Degrees,SUB81(target,0));
    TAngle<double>::TAngle(&local_70,&local_28);
    P_TraceBleed(damage,(DVector3 *)(local_68 + 8),target,(DAngle *)local_68,&local_70);
  }
  return;
}

Assistant:

void P_TraceBleed(int damage, AActor *target, AActor *missile)
{
	DAngle pitch;

	if (target == NULL || missile->flags3 & MF3_BLOODLESSIMPACT)
	{
		return;
	}

	if (missile->Vel.Z != 0)
	{
		double aim;

		aim = g_atan(missile->Vel.Z / target->Distance2D(missile));
		pitch = -DAngle::ToDegrees(aim);
	}
	else
	{
		pitch = 0.;
	}
	P_TraceBleed(damage, target->PosPlusZ(target->Height/2), target, missile->AngleTo(target), pitch);
}